

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# function-test.c++
# Opt level: O3

void __thiscall kj::anon_unknown_0::TestCase100::run(TestCase100 *this)

{
  undefined8 *puVar1;
  long *plVar2;
  long *plVar3;
  long *plVar4;
  ulong uVar5;
  Iface *ptrCopy;
  int local_60;
  int local_5c;
  DebugComparison<int,_int> _kjCondition;
  uint local_34;
  
  local_34 = 0;
  puVar1 = (undefined8 *)operator_new(0x18);
  *puVar1 = &PTR_operator___00611558;
  puVar1[1] = &local_34;
  plVar2 = (long *)operator_new(0x18);
  *plVar2 = (long)&PTR_operator___006115c0;
  plVar2[1] = (long)&local_34;
  local_34 = 3;
  plVar3 = (long *)operator_new(0x10);
  *plVar3 = (long)&PTR_operator___006115f0;
  plVar3[1] = 10;
  operator_delete(puVar1,0x18);
  _kjCondition.right = (**(code **)*plVar3)(plVar3,0x7b,0x1c8);
  _kjCondition.left = 0x24d;
  _kjCondition.op.content.ptr = " == ";
  _kjCondition.op.content.size_ = 5;
  _kjCondition.result = _kjCondition.right == 0x24d;
  if ((!_kjCondition.result) && (kj::_::Debug::minSeverity < 3)) {
    local_60 = 0x24d;
    local_5c = (**(code **)*plVar3)(plVar3,0x7b,0x1c8);
    kj::_::Debug::log<char_const(&)[51],kj::_::DebugComparison<int,int>&,int,int>
              ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/function-test.c++"
               ,0x72,ERROR,
               "\"failed: expected \" \"(123 + 456 + 10) == (f(123, 456))\", _kjCondition, 123 + 456 + 10, f(123, 456)"
               ,(char (*) [51])"failed: expected (123 + 456 + 10) == (f(123, 456))",&_kjCondition,
               &local_60,&local_5c);
  }
  _kjCondition.right = (**(code **)*plVar3)(plVar3,7,8);
  _kjCondition.left = 0x1a;
  _kjCondition.op.content.ptr = " == ";
  _kjCondition.op.content.size_ = 5;
  _kjCondition.result = _kjCondition.right == 0x1a;
  if ((!_kjCondition.result) && (kj::_::Debug::minSeverity < 3)) {
    local_60 = 0x1a;
    local_5c = (**(code **)*plVar3)(plVar3,7,8);
    kj::_::Debug::log<char_const(&)[43],kj::_::DebugComparison<int,int>&,int,int>
              ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/function-test.c++"
               ,0x73,ERROR,
               "\"failed: expected \" \"(7 + 8 + 11) == (f(7, 8))\", _kjCondition, 7 + 8 + 11, f(7, 8)"
               ,(char (*) [43])"failed: expected (7 + 8 + 11) == (f(7, 8))",&_kjCondition,&local_60,
               &local_5c);
  }
  _kjCondition.right = (**(code **)*plVar3)(plVar3,2,9);
  _kjCondition.left = 0x17;
  _kjCondition.op.content.ptr = " == ";
  _kjCondition.op.content.size_ = 5;
  _kjCondition.result = _kjCondition.right == 0x17;
  if ((!_kjCondition.result) && (kj::_::Debug::minSeverity < 3)) {
    local_60 = 0x17;
    local_5c = (**(code **)*plVar3)(plVar3,2,9);
    kj::_::Debug::log<char_const(&)[43],kj::_::DebugComparison<int,int>&,int,int>
              ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/function-test.c++"
               ,0x74,ERROR,
               "\"failed: expected \" \"(9 + 2 + 12) == (f(2, 9))\", _kjCondition, 9 + 2 + 12, f(2, 9)"
               ,(char (*) [43])"failed: expected (9 + 2 + 12) == (f(2, 9))",&_kjCondition,&local_60,
               &local_5c);
  }
  uVar5 = (ulong)local_34;
  plVar4 = (long *)operator_new(0x10);
  *plVar4 = (long)&PTR_operator___00611658;
  plVar4[1] = uVar5;
  operator_delete((void *)((long)plVar3 + *(long *)(*plVar3 + -0x10)),0x10);
  local_34 = 0x4d2;
  _kjCondition.right = (**(code **)*plVar4)(plVar4,0x7b,0x1c8);
  _kjCondition.left = 0x246;
  _kjCondition.op.content.ptr = " == ";
  _kjCondition.op.content.size_ = 5;
  _kjCondition.result = _kjCondition.right == 0x246;
  if ((!_kjCondition.result) && (kj::_::Debug::minSeverity < 3)) {
    local_60 = 0x246;
    local_5c = (**(code **)*plVar4)(plVar4,0x7b,0x1c8);
    kj::_::Debug::log<char_const(&)[50],kj::_::DebugComparison<int,int>&,int,int>
              ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/function-test.c++"
               ,0x7a,ERROR,
               "\"failed: expected \" \"(123 + 456 + 3) == (f(123, 456))\", _kjCondition, 123 + 456 + 3, f(123, 456)"
               ,(char (*) [50])"failed: expected (123 + 456 + 3) == (f(123, 456))",&_kjCondition,
               &local_60,&local_5c);
  }
  _kjCondition.right = (**(code **)*plVar4)(plVar4,7,8);
  _kjCondition.left = 0x13;
  _kjCondition.op.content.ptr = " == ";
  _kjCondition.op.content.size_ = 5;
  _kjCondition.result = _kjCondition.right == 0x13;
  if ((!_kjCondition.result) && (kj::_::Debug::minSeverity < 3)) {
    local_60 = 0x13;
    local_5c = (**(code **)*plVar4)(plVar4,7,8);
    kj::_::Debug::log<char_const(&)[42],kj::_::DebugComparison<int,int>&,int,int>
              ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/function-test.c++"
               ,0x7b,ERROR,
               "\"failed: expected \" \"(7 + 8 + 4) == (f(7, 8))\", _kjCondition, 7 + 8 + 4, f(7, 8)"
               ,(char (*) [42])"failed: expected (7 + 8 + 4) == (f(7, 8))",&_kjCondition,&local_60,
               &local_5c);
  }
  _kjCondition.right = (**(code **)*plVar4)(plVar4,2,9);
  _kjCondition.left = 0x10;
  _kjCondition.op.content.ptr = " == ";
  _kjCondition.op.content.size_ = 5;
  _kjCondition.result = _kjCondition.right == 0x10;
  if ((!_kjCondition.result) && (kj::_::Debug::minSeverity < 3)) {
    local_60 = 0x10;
    local_5c = (**(code **)*plVar4)(plVar4,2,9);
    kj::_::Debug::log<char_const(&)[42],kj::_::DebugComparison<int,int>&,int,int>
              ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/function-test.c++"
               ,0x7c,ERROR,
               "\"failed: expected \" \"(9 + 2 + 5) == (f(2, 9))\", _kjCondition, 9 + 2 + 5, f(2, 9)"
               ,(char (*) [42])"failed: expected (9 + 2 + 5) == (f(2, 9))",&_kjCondition,&local_60,
               &local_5c);
  }
  operator_delete((void *)((long)plVar2 + *(long *)(*plVar2 + -0x10)),0x18);
  operator_delete((void *)((long)plVar4 + *(long *)(*plVar4 + -0x10)),0x10);
  return;
}

Assistant:

TEST(ConstFunction, Method) {
  TestConstType obj;
  ConstFunction<int(int, int)> f = KJ_BIND_METHOD(obj, foo);
  ConstFunction<uint(uint, uint)> f2 = KJ_BIND_METHOD(obj, foo);

  EXPECT_EQ(123 + 456, f(123, 456));
  EXPECT_EQ(7 + 8 + 1, f(7, 8));
  EXPECT_EQ(9u + 2u + 2u, f2(2, 9));

  EXPECT_EQ(3, obj.callCount);

  // Bind to a temporary.
  f = KJ_BIND_METHOD(TestConstType(10), foo);

  EXPECT_EQ(123 + 456 + 10, f(123, 456));
  EXPECT_EQ(7 + 8 + 11, f(7, 8));
  EXPECT_EQ(9 + 2 + 12, f(2, 9));

  // Bind to a move.
  f = KJ_BIND_METHOD(kj::mv(obj), foo);
  obj.callCount = 1234;

  EXPECT_EQ(123 + 456 + 3, f(123, 456));
  EXPECT_EQ(7 + 8 + 4, f(7, 8));
  EXPECT_EQ(9 + 2 + 5, f(2, 9));
}